

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

void build_node(XML_Parser parser,int src_node,XML_Content *dest,XML_Content **contpos,
               XML_Char **strpos)

{
  char cVar1;
  DTD *pDVar2;
  char *pcVar3;
  int local_48;
  uint local_44;
  int cn;
  uint i;
  XML_Char *src;
  DTD *dtd;
  XML_Char **strpos_local;
  XML_Content **contpos_local;
  XML_Content *dest_local;
  int src_node_local;
  XML_Parser parser_local;
  
  pDVar2 = parser->m_dtd;
  dest->type = pDVar2->scaffold[src_node].type;
  dest->quant = pDVar2->scaffold[src_node].quant;
  if (dest->type == XML_CTYPE_NAME) {
    dest->name = *strpos;
    _cn = pDVar2->scaffold[src_node].name;
    while( true ) {
      cVar1 = *_cn;
      pcVar3 = *strpos;
      *strpos = pcVar3 + 1;
      *pcVar3 = cVar1;
      if (*_cn == '\0') break;
      _cn = _cn + 1;
    }
    dest->numchildren = 0;
    dest->children = (XML_Content *)0x0;
  }
  else {
    dest->numchildren = pDVar2->scaffold[src_node].childcnt;
    dest->children = *contpos;
    *contpos = *contpos + dest->numchildren;
    local_44 = 0;
    local_48 = pDVar2->scaffold[src_node].firstchild;
    for (; local_44 < dest->numchildren; local_44 = local_44 + 1) {
      build_node(parser,local_48,dest->children + local_44,contpos,strpos);
      local_48 = pDVar2->scaffold[local_48].nextsib;
    }
    dest->name = (XML_Char *)0x0;
  }
  return;
}

Assistant:

static void
build_node(XML_Parser parser,
           int src_node,
           XML_Content *dest,
           XML_Content **contpos,
           XML_Char **strpos)
{
  DTD * const dtd = _dtd;  /* save one level of indirection */
  dest->type = dtd->scaffold[src_node].type;
  dest->quant = dtd->scaffold[src_node].quant;
  if (dest->type == XML_CTYPE_NAME) {
    const XML_Char *src;
    dest->name = *strpos;
    src = dtd->scaffold[src_node].name;
    for (;;) {
      *(*strpos)++ = *src;
      if (!*src)
        break;
      src++;
    }
    dest->numchildren = 0;
    dest->children = NULL;
  }
  else {
    unsigned int i;
    int cn;
    dest->numchildren = dtd->scaffold[src_node].childcnt;
    dest->children = *contpos;
    *contpos += dest->numchildren;
    for (i = 0, cn = dtd->scaffold[src_node].firstchild;
         i < dest->numchildren;
         i++, cn = dtd->scaffold[cn].nextsib) {
      build_node(parser, cn, &(dest->children[i]), contpos, strpos);
    }
    dest->name = NULL;
  }
}